

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O2

void __thiscall
PendingSetterGetter::PendingSetterGetter
          (PendingSetterGetter *this,string *sn,string *t,string *n,size_t i)

{
  std::__cxx11::string::string((string *)this,(string *)sn);
  std::__cxx11::string::string((string *)&this->type,(string *)t);
  std::__cxx11::string::string((string *)&this->name,(string *)n);
  this->idx = i;
  return;
}

Assistant:

PendingSetterGetter(const string& sn, const string& t,
        const string& n, size_t i) :
        structName(sn), type(t), name(n), idx(i) { }